

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QString * __thiscall QGraphicsItem::toolTip(QString *__return_storage_ptr__,QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  ulong uVar2;
  ExtraStruct *pEVar3;
  ExtraStruct *pEVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  uVar2 = (pQVar1->extras).d.size;
  if (uVar2 != 0) {
    pEVar4 = (pQVar1->extras).d.ptr;
    if (pEVar4->type == ExtraToolTip) {
      ::QVariant::QVariant((QVariant *)&local_48,&pEVar4->value);
      goto LAB_005e866c;
    }
    uVar5 = 0;
    do {
      pEVar3 = pEVar4;
      pEVar4 = pEVar3 + 1;
      if (uVar2 - 1 == uVar5) goto LAB_005e8645;
      uVar5 = uVar5 + 1;
    } while (pEVar4->type != ExtraToolTip);
    ::QVariant::QVariant((QVariant *)&local_48,&pEVar3[1].value);
    if (uVar5 < uVar2) goto LAB_005e866c;
  }
LAB_005e8645:
  local_48.shared = (PrivateShared *)0x0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  local_30 = 2;
LAB_005e866c:
  ::QVariant::toString();
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QGraphicsItem::toolTip() const
{
    return d_ptr->extra(QGraphicsItemPrivate::ExtraToolTip).toString();
}